

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsettingsd.cc
# Opt level: O2

int main(int argc,char **argv)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  undefined8 *puVar6;
  option *poVar7;
  size_t i;
  long local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string config_file;
  SettingsManager manager;
  option options [4];
  
  config_file._M_dataplus._M_p = (pointer)&config_file.field_2;
  config_file._M_string_length = 0;
  config_file.field_2._M_local_buf[0] = '\0';
  puVar6 = &DAT_0010bb80;
  poVar7 = options;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    poVar7->name = (char *)*puVar6;
    puVar6 = puVar6 + 1;
    poVar7 = (option *)&poVar7->has_arg;
  }
  _opterr = 0;
  local_178 = -1;
  do {
    while( true ) {
      while (iVar3 = getopt_long(argc,argv,"c:hs:",options,0), iVar3 == 99) {
        std::__cxx11::string::assign((char *)&config_file);
      }
      if (iVar3 == -1) {
        if (config_file._M_string_length != 0) goto LAB_0010371b;
        xsettingsd::GetDefaultConfigFilePaths_abi_cxx11_();
        lVar4 = 0;
        uVar5 = 0;
        goto LAB_0010368d;
      }
      if (iVar3 != 0x73) break;
      manager.config_filename_._M_dataplus._M_p = (pointer)0x0;
      local_178 = strtol(_optarg,(char **)&manager,10);
      if (((*_optarg == '\0') || (*manager.config_filename_._M_dataplus._M_p != '\0')) ||
         ((int)local_178 < 0)) {
        fprintf(_stderr,"Invalid screen \"%s\"\n");
        goto LAB_001037ad;
      }
    }
  } while ((iVar3 != 0x3f) && (iVar3 != 0x68));
  fputs("Usage: xsettingsd [OPTION] ...\n\nDaemon implementing the XSETTINGS spec to control settings for X11\napplications.\n\nOptions: -c, --config=FILE    config file (default is ~/.xsettingsd)\n         -h, --help           print this help message\n         -s, --screen=SCREEN  screen to use (default is all)\n"
        ,_stderr);
LAB_001037ad:
  iVar3 = 1;
  goto LAB_00103779;
LAB_0010368d:
  if ((ulong)((long)paths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)paths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar5) goto LAB_001036bb;
  iVar3 = access(*(char **)((long)&((paths.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar4),4);
  if (iVar3 == 0) {
    std::__cxx11::string::string
              ((string *)&manager,
               (string *)
               ((long)&((paths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
    goto LAB_001036e0;
  }
  uVar5 = uVar5 + 1;
  lVar4 = lVar4 + 0x20;
  goto LAB_0010368d;
LAB_001036bb:
  manager.config_filename_._M_dataplus._M_p = (pointer)&manager.config_filename_.field_2;
  manager.config_filename_._M_string_length = 0;
  manager.config_filename_.field_2._M_local_buf[0] = '\0';
LAB_001036e0:
  std::__cxx11::string::operator=((string *)&config_file,(string *)&manager);
  std::__cxx11::string::~string((string *)&manager);
  sVar1 = config_file._M_string_length;
  iVar3 = 0;
  if (config_file._M_string_length == 0) {
    fprintf(_stderr,"%s: Couldn\'t find config file. Tried the following:\n",xsettingsd::kProgName);
    iVar3 = 1;
    lVar4 = 0;
    for (uVar5 = 0;
        uVar5 < (ulong)((long)paths.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)paths.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
      fprintf(_stderr,"  %s\n",
              *(undefined8 *)
               ((long)&((paths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
      lVar4 = lVar4 + 0x20;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&paths);
  if (sVar1 != 0) {
LAB_0010371b:
    xsettingsd::SettingsManager::SettingsManager(&manager,&config_file);
    bVar2 = xsettingsd::SettingsManager::LoadConfig(&manager);
    if (bVar2) {
      iVar3 = 1;
      bVar2 = xsettingsd::SettingsManager::InitX11(&manager,(int)local_178,true);
      if (bVar2) {
        signal(1,anon_unknown.dwarf_2a97::HandleSignal);
        iVar3 = 0;
        xsettingsd::SettingsManager::RunEventLoop(&manager);
      }
    }
    else {
      iVar3 = 1;
    }
    xsettingsd::SettingsManager::~SettingsManager(&manager);
  }
LAB_00103779:
  std::__cxx11::string::~string((string *)&config_file);
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {
  static const char* kUsage =
      "Usage: xsettingsd [OPTION] ...\n"
      "\n"
      "Daemon implementing the XSETTINGS spec to control settings for X11\n"
      "applications.\n"
      "\n"
      "Options: -c, --config=FILE    config file (default is ~/.xsettingsd)\n"
      "         -h, --help           print this help message\n"
      "         -s, --screen=SCREEN  screen to use (default is all)\n";

  int screen = -1;
  string config_file;

  struct option options[] = {
    { "config", 1, NULL, 'c', },
    { "help", 0, NULL, 'h', },
    { "screen", 1, NULL, 's', },
    { NULL, 0, NULL, 0 },
  };

  opterr = 0;
  while (true) {
    int ch = getopt_long(argc, argv, "c:hs:", options, NULL);
    if (ch == -1) {
      break;
    } else if (ch == 'c') {
      config_file = optarg;
    } else if (ch == 'h' || ch == '?') {
      fprintf(stderr, "%s", kUsage);
      return 1;
    } else if (ch == 's') {
      char* endptr = NULL;
      screen = strtol(optarg, &endptr, 10);
      if (optarg[0] == '\0' || endptr[0] != '\0' || screen < 0) {
        fprintf(stderr, "Invalid screen \"%s\"\n", optarg);
        return 1;
      }
    }
  }

  // Check default config file locations if one wasn't supplied via a flag.
  if (config_file.empty()) {
    const vector<string> paths = xsettingsd::GetDefaultConfigFilePaths();
    config_file = GetFirstReadablePath(paths);
    if (config_file.empty()) {
      fprintf(stderr, "%s: Couldn't find config file. Tried the following:\n",
              xsettingsd::kProgName);
      for (size_t i = 0; i < paths.size(); ++i)
        fprintf(stderr, "  %s\n", paths[i].c_str());
      return 1;
    }
  }

  xsettingsd::SettingsManager manager(config_file);
  if (!manager.LoadConfig())
    return 1;
  if (!manager.InitX11(screen, true))
    return 1;

  signal(SIGHUP, HandleSignal);

  manager.RunEventLoop();
  return 0;
}